

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-rng-posix-crypto-impl.c
# Opt level: O0

int ndn_lite_posix_rng(uint8_t *dest,uint size)

{
  int __fd;
  ssize_t sVar1;
  int result;
  int randomData;
  uint size_local;
  uint8_t *dest_local;
  
  __fd = open("/dev/urandom",0);
  if (__fd < 0) {
    dest_local._4_4_ = 0;
  }
  else {
    sVar1 = read(__fd,dest,(ulong)size);
    if ((int)sVar1 < 0) {
      dest_local._4_4_ = 0;
    }
    else {
      dest_local._4_4_ = 1;
    }
  }
  return dest_local._4_4_;
}

Assistant:

int
ndn_lite_posix_rng(uint8_t *dest, unsigned size)
{
#if defined(__APPLE__)
  arc4random_buf((void*)dest, size);
  return 1;
#endif
  int randomData = open("/dev/urandom", O_RDONLY);
  if (randomData < 0) {
    return 0;
  }
  else {
    int result = read(randomData, dest, size);
    if (result < 0) {
      return 0;
    }
  }
  return 1;
}